

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t internal_exr_parse_header(exr_context_t ctxt)

{
  exr_priv_part_t p_Var1;
  uint8_t uVar2;
  exr_result_t eVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  exr_context_t in_RDI;
  exr_priv_part_t curp;
  int mismatchcount;
  char *mismatch [4];
  int p;
  exr_result_t rv;
  uint32_t flags;
  uint8_t next_byte;
  uint64_t initpos;
  exr_priv_part_t curpart;
  _internal_exr_seq_scratch scratch;
  uint64_t in_stack_fffffffffffffe98;
  exr_priv_part_t in_stack_fffffffffffffea0;
  exr_context_t in_stack_fffffffffffffea8;
  uint64_t *in_stack_fffffffffffffeb8;
  char **in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  exr_priv_part_t in_stack_fffffffffffffed0;
  exr_priv_part_t in_stack_fffffffffffffed8;
  exr_context_t in_stack_fffffffffffffee0;
  char *local_118;
  exr_priv_part_t in_stack_fffffffffffffef0;
  exr_context_t in_stack_fffffffffffffef8;
  exr_priv_part_t local_100;
  char *local_e8;
  exr_attr_chlist_entry_t *local_d8;
  char *local_a8;
  exr_priv_part_t local_a0;
  char *local_98;
  char *local_90;
  uint local_88;
  int local_84;
  uint local_80;
  char local_79 [9];
  exr_priv_part_t local_70;
  undefined1 local_68 [32];
  code *in_stack_ffffffffffffffb8;
  exr_priv_part_t *in_stack_ffffffffffffffc0;
  exr_context_t in_stack_ffffffffffffffc8;
  exr_result_t local_24;
  
  local_80 = 0;
  local_84 = 0x21;
  if (in_RDI->silent_header != '\0') {
    in_RDI->standard_error = silent_standard_error;
    in_RDI->report_error = silent_error;
    in_RDI->print_error = silent_print_error;
  }
  local_84 = read_magic_and_flags
                       ((exr_context_t)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
                        ,(uint32_t *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  if (local_84 == 0) {
    local_84 = priv_init_scratch(in_stack_fffffffffffffea8,
                                 (_internal_exr_seq_scratch *)in_stack_fffffffffffffea0,
                                 in_stack_fffffffffffffe98);
    if (local_84 == 0) {
      local_70 = *in_RDI->parts;
      if (local_70 == (exr_priv_part_t)0x0) {
        local_84 = (*in_RDI->report_error)(in_RDI,3,"Error during file initialization");
        priv_destroy_scratch((_internal_exr_seq_scratch *)in_stack_fffffffffffffea0);
        local_24 = internal_exr_context_restore_handlers(in_RDI,local_84);
      }
      else {
        in_RDI->is_singlepart_tiled = (local_80 & 0x200) != 0;
        if (in_RDI->strict_header == '\0') {
          in_RDI->max_name_length = 0xff;
        }
        else {
          uVar2 = '\x1f';
          if ((local_80 & 0x400) != 0) {
            uVar2 = 0xff;
          }
          in_RDI->max_name_length = uVar2;
        }
        in_RDI->has_nonimage_data = (local_80 & 0x800) != 0;
        in_RDI->is_multipart = (local_80 & 0x1000) != 0;
        if ((in_RDI->is_singlepart_tiled == '\0') ||
           ((in_RDI->has_nonimage_data == '\0' && (in_RDI->is_multipart == '\0')))) {
          if ((in_RDI->has_nonimage_data == '\0') && (in_RDI->is_multipart == '\0')) {
            if (in_RDI->is_singlepart_tiled == '\0') {
              local_70->storage_mode = EXR_STORAGE_SCANLINE;
            }
            else {
              local_70->storage_mode = EXR_STORAGE_TILED;
            }
          }
          local_84 = 0;
          local_100 = in_stack_fffffffffffffea0;
LAB_001bf368:
          local_84 = (*in_stack_ffffffffffffffb8)(local_68,local_79,1);
          if (local_84 != 0) {
            local_84 = (*in_RDI->report_error)(in_RDI,6,"Unable to extract header byte");
            priv_destroy_scratch((_internal_exr_seq_scratch *)local_100);
            eVar3 = internal_exr_context_restore_handlers(in_RDI,local_84);
            return eVar3;
          }
          iVar4 = 0;
          if (local_79[0] != '\0') goto LAB_001bf517;
          local_84 = internal_exr_validate_read_part(in_stack_fffffffffffffea8,local_100);
          if (local_84 != 0) {
            priv_destroy_scratch((_internal_exr_seq_scratch *)local_100);
            eVar3 = internal_exr_context_restore_handlers(in_RDI,local_84);
            return eVar3;
          }
          if (in_RDI->is_multipart == '\0') {
            local_84 = 0;
          }
          else {
            local_84 = (*in_stack_ffffffffffffffb8)(local_68,local_79,1);
            if (local_84 != 0) {
              local_84 = (*in_RDI->report_error)(in_RDI,6,"Unable to go to next part definition");
              priv_destroy_scratch((_internal_exr_seq_scratch *)local_100);
              eVar3 = internal_exr_context_restore_handlers(in_RDI,local_84);
              return eVar3;
            }
            if (local_79[0] != '\0') {
              iVar4 = internal_exr_add_part
                                (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                                 (int *)in_stack_ffffffffffffffb8);
              goto LAB_001bf517;
            }
            local_84 = 0;
          }
          goto LAB_001bf580;
        }
        local_84 = (*in_RDI->print_error)
                             (in_RDI,6,
                              "Invalid combination of version flags: single part flag found, but also marked as deep (%d) or multipart (%d)"
                              ,(ulong)in_RDI->has_nonimage_data,(ulong)in_RDI->is_multipart);
        priv_destroy_scratch((_internal_exr_seq_scratch *)in_stack_fffffffffffffea0);
        local_24 = internal_exr_context_restore_handlers(in_RDI,local_84);
      }
    }
    else {
      priv_destroy_scratch((_internal_exr_seq_scratch *)in_stack_fffffffffffffea0);
      local_24 = internal_exr_context_restore_handlers(in_RDI,local_84);
    }
  }
  else {
    local_24 = internal_exr_context_restore_handlers(in_RDI,local_84);
  }
  return local_24;
LAB_001bf517:
  local_84 = iVar4;
  if (local_84 == 0) {
    local_84 = pull_attr(_flags,_p,mismatch[3]._7_1_,(_internal_exr_seq_scratch *)mismatch[2]);
  }
  if (local_84 != 0) {
    if (in_RDI->strict_header != '\0') {
LAB_001bf580:
      if (local_84 != 0) goto LAB_001bf89c;
      local_88 = 1;
      goto LAB_001bf599;
    }
    local_84 = 0;
  }
  goto LAB_001bf368;
LAB_001bf599:
  if (in_RDI->num_parts <= (int)local_88) {
LAB_001bf89c:
    if (local_84 == 0) {
      local_84 = update_chunk_offsets
                           (in_stack_fffffffffffffef8,
                            (_internal_exr_seq_scratch *)in_stack_fffffffffffffef0);
    }
    priv_destroy_scratch((_internal_exr_seq_scratch *)local_100);
    eVar3 = internal_exr_context_restore_handlers(in_RDI,local_84);
    return eVar3;
  }
  memset(&local_a8,0,0x20);
  p_Var1 = in_RDI->parts[(int)local_88];
  local_84 = internal_exr_validate_shared_attrs
                       (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                        in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                        in_stack_fffffffffffffec0,(int *)in_stack_fffffffffffffeb8);
  if (local_84 != 0) {
    if (p_Var1->name == (exr_attribute_t *)0x0) {
      local_d8 = (exr_attr_chlist_entry_t *)0x20949b;
    }
    else {
      local_d8 = ((p_Var1->name->field_6).chlist)->entries;
    }
    if (local_a8 == (char *)0x0) {
      local_e8 = "";
    }
    else {
      local_e8 = local_a8;
    }
    pcVar5 = "";
    if (local_a8 != (char *)0x0) {
      pcVar5 = " ";
    }
    if (local_a0 == (exr_priv_part_t)0x0) {
      local_100 = (exr_priv_part_t)0x202077;
    }
    else {
      local_100 = local_a0;
    }
    in_stack_fffffffffffffef8 = (exr_context_t)0x202077;
    if (local_a0 != (exr_priv_part_t)0x0) {
      in_stack_fffffffffffffef8 = (exr_context_t)0x202cc4;
    }
    if (local_98 == (char *)0x0) {
      local_118 = "";
    }
    else {
      local_118 = local_98;
    }
    pcVar6 = "";
    if (local_98 != (char *)0x0) {
      pcVar6 = " ";
    }
    if (local_90 == (char *)0x0) {
      local_90 = "";
    }
    in_stack_fffffffffffffef0 = local_100;
    local_84 = (*in_RDI->print_error)
                         (in_RDI,local_84,
                          "Part %d (%s) has non-conforming shared attributes: %s%s%s%s%s%s%s",
                          (ulong)local_88,local_d8,local_e8,pcVar5,local_100,
                          in_stack_fffffffffffffef8,local_118,pcVar6,local_90);
    goto LAB_001bf89c;
  }
  local_88 = local_88 + 1;
  local_84 = 0;
  goto LAB_001bf599;
}

Assistant:

exr_result_t
internal_exr_parse_header (exr_context_t ctxt)
{
    struct _internal_exr_seq_scratch scratch;
    exr_priv_part_t                  curpart;
    uint64_t                         initpos;
    uint8_t                          next_byte;
    uint32_t                         flags = 0;
    exr_result_t                     rv    = EXR_ERR_UNKNOWN;

    if (ctxt->silent_header)
    {
        ctxt->standard_error = &silent_standard_error;
        ctxt->report_error   = &silent_error;
        ctxt->print_error    = &silent_print_error;
    }
    rv = read_magic_and_flags (ctxt, &flags, &initpos);
    if (rv != EXR_ERR_SUCCESS)
        return internal_exr_context_restore_handlers (ctxt, rv);

    rv = priv_init_scratch (ctxt, &scratch, initpos);
    if (rv != EXR_ERR_SUCCESS)
    {
        priv_destroy_scratch (&scratch);
        return internal_exr_context_restore_handlers (ctxt, rv);
    }

    curpart = ctxt->parts[0];
    if (!curpart)
    {
        rv = ctxt->report_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "Error during file initialization");
        priv_destroy_scratch (&scratch);
        return internal_exr_context_restore_handlers (ctxt, rv);
    }

    ctxt->is_singlepart_tiled = (flags & EXR_TILED_FLAG) ? 1 : 0;
    if (ctxt->strict_header)
    {
        ctxt->max_name_length = (flags & EXR_LONG_NAMES_FLAG)
                                    ? EXR_LONGNAME_MAXLEN
                                    : EXR_SHORTNAME_MAXLEN;
    }
    else { ctxt->max_name_length = EXR_LONGNAME_MAXLEN; }
    ctxt->has_nonimage_data = (flags & EXR_NON_IMAGE_FLAG) ? 1 : 0;
    ctxt->is_multipart      = (flags & EXR_MULTI_PART_FLAG) ? 1 : 0;
    if (ctxt->is_singlepart_tiled)
    {
        if (ctxt->has_nonimage_data || ctxt->is_multipart)
        {
            // this appears to always be fatal, so do not check strict / not
            rv = ctxt->print_error (
                ctxt,
                EXR_ERR_FILE_BAD_HEADER,
                "Invalid combination of version flags: single part flag found, but also marked as deep (%d) or multipart (%d)",
                (int) ctxt->has_nonimage_data,
                (int) ctxt->is_multipart);
            priv_destroy_scratch (&scratch);
            return internal_exr_context_restore_handlers (ctxt, rv);
        }
    }

    /* leave storage mode uninitialized until we encounter the type */
    if (!ctxt->has_nonimage_data && !ctxt->is_multipart)
    {
        if (ctxt->is_singlepart_tiled)
            curpart->storage_mode = EXR_STORAGE_TILED;
        else
            curpart->storage_mode = EXR_STORAGE_SCANLINE;
    }

    do
    {
        rv = scratch.sequential_read (&scratch, &next_byte, 1);
        if (rv != EXR_ERR_SUCCESS)
        {
            rv = ctxt->report_error (
                ctxt, EXR_ERR_FILE_BAD_HEADER, "Unable to extract header byte");
            priv_destroy_scratch (&scratch);
            return internal_exr_context_restore_handlers (ctxt, rv);
        }

        if (next_byte == '\0')
        {
            rv = internal_exr_validate_read_part (ctxt, curpart);
            if (rv != EXR_ERR_SUCCESS)
            {
                priv_destroy_scratch (&scratch);
                return internal_exr_context_restore_handlers (ctxt, rv);
            }

            if (!ctxt->is_multipart)
            {
                /* got a terminal mark, not multipart, so finished */
                break;
            }

            rv = scratch.sequential_read (&scratch, &next_byte, 1);
            if (rv != EXR_ERR_SUCCESS)
            {
                rv = ctxt->report_error (
                    ctxt,
                    EXR_ERR_FILE_BAD_HEADER,
                    "Unable to go to next part definition");
                priv_destroy_scratch (&scratch);
                return internal_exr_context_restore_handlers (ctxt, rv);
            }

            if (next_byte == '\0')
            {
                /* got a second terminator, finished with the
                 * headers, can read chunk offsets next */
                break;
            }

            rv = internal_exr_add_part (ctxt, &curpart, NULL);
        }

        if (rv == EXR_ERR_SUCCESS)
            rv = pull_attr (ctxt, curpart, next_byte, &scratch);
        if (rv != EXR_ERR_SUCCESS)
        {
            if (ctxt->strict_header) { break; }
            rv = EXR_ERR_SUCCESS;
        }
    } while (1);

    if (rv == EXR_ERR_SUCCESS)
    {
        for ( int p = 1; p < ctxt->num_parts; ++p )
        {
            const char *mismatch[4] = { NULL, NULL, NULL, NULL };
            int mismatchcount = 0;
            exr_priv_part_t curp = ctxt->parts[p];

            rv = internal_exr_validate_shared_attrs (ctxt,
                                                     ctxt->parts[0],
                                                     curp,
                                                     p,
                                                     mismatch,
                                                     &mismatchcount);
            if (rv != EXR_ERR_SUCCESS)
            {
                rv = ctxt->print_error (
                    ctxt,
                    rv,
                    "Part %d (%s) has non-conforming shared attributes: %s%s%s%s%s%s%s",
                    p, curp->name ? curp->name->string->str : "<missing name>",
                    mismatch[0] ? mismatch[0] : "",
                    mismatch[0] ? " " : "",
                    mismatch[1] ? mismatch[1] : "",
                    mismatch[1] ? " " : "",
                    mismatch[2] ? mismatch[2] : "",
                    mismatch[2] ? " " : "",
                    mismatch[3] ? mismatch[3] : "");

                // MultiPartInputFile would fail unconditionally
                break;
                //rv = EXR_ERR_SUCCESS;
            }
        }
    }

    if (rv == EXR_ERR_SUCCESS) { rv = update_chunk_offsets (ctxt, &scratch); }

    priv_destroy_scratch (&scratch);
    return internal_exr_context_restore_handlers (ctxt, rv);
}